

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O1

QRgbaFloat32 *
fetchIndexedToRGBA32F<(QPixelLayout::BPP)3>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *clut,
          QDitherInfo *param_6)

{
  uint uVar1;
  uint6 uVar2;
  float *pfVar3;
  ulong uVar4;
  float fVar5;
  
  if (0 < count) {
    pfVar3 = &buffer->b;
    uVar4 = 0;
    do {
      uVar1 = (clut->d).ptr[src[uVar4 + (long)index]];
      uVar2 = (uint6)CONCAT14((char)(uVar1 >> 0x18),uVar1) & 0xffff000000ff;
      fVar5 = (float)(ushort)(uVar2 >> 0x20) * 0.003921569;
      ((QRgbaFloat32 *)(pfVar3 + -2))->r = (float)(uVar1 >> 0x10 & 0xff) * 0.003921569 * fVar5;
      pfVar3[-1] = fVar5 * (float)(uVar1 >> 8 & 0xff) * 0.003921569;
      *pfVar3 = (float)(int)uVar2 * 0.003921569 * fVar5;
      pfVar3[1] = fVar5;
      uVar4 = uVar4 + 1;
      pfVar3 = pfVar3 + 4;
    } while ((uint)count != uVar4);
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchIndexedToRGBA32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                         const QList<QRgb> *clut, QDitherInfo *)
{
    for (int i = 0; i < count; ++i) {
        const uint s = fetchPixel<BPP>(src, index + i);
        buffer[i] = QRgbaFloat32::fromArgb32(clut->at(s)).premultiplied();
    }
    return buffer;
}